

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O3

void write_constraint<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::raw_problem,baryonyx::constraint>
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,
               raw_problem *p,constraint *cst,char *separator)

{
  size_t sVar1;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  char *local_48;
  size_t local_40;
  ulong local_38;
  
  sVar1 = (cst->label)._M_len;
  if (sVar1 != 0) {
    local_48 = (cst->label)._M_str;
    format_str.size_ = 4;
    format_str.data_ = "{}: ";
    args.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_48;
    args.desc_ = 0xd;
    local_40 = sVar1;
    fmt::v7::detail::vformat_to<char>
              ((ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
               format_str,args,(locale_ref)0x0);
  }
  write_function_element<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::raw_problem,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
            (ctx,p,&cst->elements);
  local_38 = (ulong)(uint)cst->value;
  format_str_00.size_ = 5;
  format_str_00.data_ = "{}{}\n";
  args_00.field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_48;
  args_00.desc_ = 0x1c;
  local_48 = separator;
  fmt::v7::detail::vformat_to<char>
            ((ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
             format_str_00,args_00,(locale_ref)0x0);
  return;
}

Assistant:

void
write_constraint(FormatContext& ctx,
                 const Problem& p,
                 const Constraint& cst,
                 const char* separator)
{
    if (!cst.label.empty())
        fmt::format_to(ctx.out(), "{}: ", cst.label);

    write_function_element(ctx, p, cst.elements);

    fmt::format_to(ctx.out(), "{}{}\n", separator, cst.value);
}